

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

bool __thiscall
deqp::gls::FboUtil::ValidStatusCodes::isFBOStatusValid(ValidStatusCodes *this,GLenum fboStatus)

{
  int iVar1;
  int iVar2;
  pointer pRVar3;
  int iVar4;
  int iVar5;
  
  if (fboStatus == 0x8cd5) {
    return this->m_allowComplete;
  }
  pRVar3 = (this->m_errorStatuses).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = (int)((ulong)((long)(this->m_errorStatuses).
                              super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3);
  iVar4 = iVar2 * -0x49249249;
  if ((iVar4 < 1) || (pRVar3->errorCode == fboStatus)) {
    return 0 < iVar4;
  }
  iVar1 = 1;
  do {
    iVar5 = iVar1;
    pRVar3 = pRVar3 + 1;
    if (iVar4 == iVar5) break;
    iVar1 = iVar5 + 1;
  } while (pRVar3->errorCode != fboStatus);
  return SBORROW4(iVar5,iVar4) != iVar5 + iVar2 * 0x49249249 < 0;
}

Assistant:

bool ValidStatusCodes::isFBOStatusValid (glw::GLenum fboStatus) const
{
	if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
		return m_allowComplete;
	else
	{
		// rule violation exists?
		for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		{
			if (m_errorStatuses[ndx].errorCode == fboStatus)
				return true;
		}
		return false;
	}
}